

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_syntax.cpp
# Opt level: O1

ParserResult *
parse_variable_declaration
          (ParserResult *__return_storage_ptr__,ParserContext *parser,token_iterator begin,
          token_iterator end)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Token TVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  uint uVar4;
  size_t sVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  undefined4 uVar7;
  token_iterator pTVar8;
  undefined1 auVar9 [8];
  undefined8 uVar10;
  bool bVar11;
  SyntaxTree *pSVar12;
  uint uVar13;
  undefined1 auVar14 [8];
  NodeType NVar15;
  initializer_list<ParserError> IL;
  pair<const_TokenStream::TokenData_*,_eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>_>
  rule_result;
  ParserError e;
  ParserState idents;
  size_type __dnew;
  anon_class_1_0_00000001 local_281;
  token_iterator local_280;
  shared_ptr<SyntaxTree> local_278;
  undefined1 local_268 [32];
  undefined1 local_248 [8];
  undefined1 auStack_240 [88];
  ParserError local_1e8;
  ParserResult *local_1b0;
  undefined1 local_1a8 [80];
  size_t local_158;
  anon_union_80_3_1618c560_for__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>_3
  local_148;
  long local_f8;
  undefined1 local_e8 [8];
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
  local_e0;
  ParserState local_88;
  
  local_280 = begin;
  local_268._24_8_ = parser;
  if (begin == end) goto LAB_0019c468;
  TVar2 = begin->type;
  uVar13 = 0xf;
  if (TVar2 != LVAR_TEXT_LABEL16) {
    uVar13 = 0;
  }
  uVar4 = TVar2 - Label;
  if (6 < TVar2 - VAR_INT) {
    uVar4 = uVar13;
  }
  if (uVar4 == 0) goto LAB_0019c468;
  local_148._64_8_ = 0;
  local_148._72_8_ = 0;
  local_148._48_8_ = 0;
  local_148._56_8_ = 0;
  local_148._32_8_ = 0;
  local_148._40_8_ = 0;
  local_148._16_8_ = 0;
  local_148._24_8_ = 0;
  local_148._0_8_ = 0;
  local_148._8_8_ = 0;
  local_f8 = 0;
  pSVar12 = (SyntaxTree *)operator_new(0x88);
  (pSVar12->parent_).super_OptionalBase<std::weak_ptr<SyntaxTree>_>.storage_.dummy_ = '\0';
  (pSVar12->udata).vtable = (vtable_type *)0x0;
  (pSVar12->instream).super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (pSVar12->instream).super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pSVar12->childs).
  super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pSVar12->childs).
  super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(pSVar12->childs).
           super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(pSVar12->childs).
           super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (pSVar12->super_enable_shared_from_this<SyntaxTree>)._M_weak_this.
  super___weak_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (pSVar12->super_enable_shared_from_this<SyntaxTree>)._M_weak_this.
  super___weak_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pSVar12->type_ = Block;
  std::__shared_ptr<SyntaxTree,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SyntaxTree,void>
            ((__shared_ptr<SyntaxTree,(__gnu_cxx::_Lock_policy)2> *)&local_1e8,pSVar12);
  auVar14 = (undefined1  [8])(begin + 1);
  local_1a8._0_8_ = (SyntaxTree *)0x0;
  local_1a8._8_8_ = (token_iterator)0x0;
  local_158 = 1;
  local_268._16_8_ = (ulong)uVar4;
  local_1b0 = __return_storage_ptr__;
  if (auVar14 != (undefined1  [8])end) {
    do {
      if (*(Token *)&(((SyntaxTree *)auVar14)->super_enable_shared_from_this<SyntaxTree>).
                     _M_weak_this.super___weak_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          NewLine) break;
      parse_identifier((ParserResult *)local_248,(ParserContext *)local_268._24_8_,
                       (token_iterator)auVar14,end);
      bVar11 = eggs::variants::detail::
               apply<bool,is<ParserSuccess,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>(eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>const&)::_lambda(auto:1_const&)_1_,eggs::variants::detail::_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>,false,false>const&>
                         (&local_281,
                          (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                           *)auStack_240);
      if (bVar11) {
        bVar11 = eggs::variants::detail::
                 apply<bool,is<ParserSuccess,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>(eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>const&)::_lambda(auto:1_const&)_1_,eggs::variants::detail::_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>,false,false>const&>
                           (&local_281,
                            (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                             *)local_1a8);
        if (bVar11) {
          if (auStack_240._80_8_ != 1) {
            eggs::variants::detail::throw_bad_variant_access<ParserSuccess&>();
          }
          local_278.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)auStack_240._0_8_;
          local_278.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_240._8_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_240._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(auStack_240._8_8_ + 8) =
                   *(_Atomic_word *)(auStack_240._8_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(auStack_240._8_8_ + 8) =
                   *(_Atomic_word *)(auStack_240._8_8_ + 8) + 1;
            }
          }
          SyntaxTree::add_child((SyntaxTree *)local_1e8._0_8_,&local_278);
          if (local_278.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_278.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
      }
      else {
        if (auStack_240._80_8_ != 2) {
          eggs::variants::detail::
          throw_bad_variant_access<llvm_vecsmall::SmallVector<ParserError,1u>&>();
        }
        add_error((ParserState *)local_1a8,(ParserFailure *)auStack_240);
      }
      auVar14 = local_248;
      eggs::variants::detail::
      _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
      ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                  *)auStack_240);
    } while (auVar14 != (undefined1  [8])end);
  }
  bVar11 = eggs::variants::detail::
           apply<bool,is<ParserSuccess,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>(eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>const&)::_lambda(auto:1_const&)_1_,eggs::variants::detail::_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>,false,false>const&>
                     ((anon_class_1_0_00000001 *)local_248,
                      (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                       *)local_1a8);
  __return_storage_ptr__ = local_1b0;
  pTVar8 = local_1e8.context;
  uVar10 = local_1e8._0_8_;
  NVar15 = (NodeType)local_268._16_8_;
  local_e8 = auVar14;
  if (bVar11) {
    local_1e8._0_8_ = (SyntaxTree *)0x0;
    local_1e8.context = (token_iterator)0x0;
    local_e0.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    .
    super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
    .field_0._0_8_ = uVar10;
    local_e0.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    .
    super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
    .field_0._8_8_ = pTVar8;
    local_e0.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    ._which = 1;
  }
  else {
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    ::_storage(&local_e0.
                super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
               ,(_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                 *)local_1a8);
  }
  eggs::variants::detail::
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
  ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
              *)local_1a8);
  if (local_1e8.context != (token_iterator)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8.context);
  }
  auVar14 = local_e8;
  eggs::variants::detail::
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
  ::operator=((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
               *)&local_148._tail,&local_e0);
  eggs::variants::detail::
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
  ::_destroy(&local_e0);
  if (auVar14 != (undefined1  [8])end) {
    if (*(Token *)&(((enable_shared_from_this<SyntaxTree> *)auVar14)->_M_weak_this).
                   super___weak_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr != NewLine) {
      __assert_fail("it->type == Token::NewLine",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/parser_syntax.cpp"
                    ,0x36b,
                    "ParserResult parse_variable_declaration(ParserContext &, token_iterator, token_iterator)"
                   );
    }
    auVar14 = (undefined1  [8])((long)auVar14 + 0x18);
  }
  bVar11 = eggs::variants::detail::
           apply<bool,is<ParserSuccess,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>(eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>const&)::_lambda(auto:1_const&)_1_,eggs::variants::detail::_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>,false,false>const&>
                     ((anon_class_1_0_00000001 *)local_248,
                      (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                       *)&local_148._tail);
  pTVar8 = local_280;
  if (bVar11) {
    if (local_f8 != 1) {
      eggs::variants::detail::throw_bad_variant_access<ParserSuccess&>();
    }
    if (*(long *)(local_148._0_8_ + 0x48) != *(long *)(local_148._0_8_ + 0x40)) goto LAB_0019c133;
    local_e8 = (undefined1  [8])0x24;
    local_278.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_268;
    local_1a8._16_8_ = std::__cxx11::string::_M_create((ulong *)&local_278,(ulong)local_e8);
    *(undefined8 *)&((element_type *)local_1a8._16_8_)->type_ = 0x6574666120726569;
    *(undefined8 *)&((element_type *)local_1a8._16_8_)->token = 0x7420736968742072;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&((element_type *)local_1a8._16_8_)->super_enable_shared_from_this<SyntaxTree>)->
    _M_allocated_capacity = 0x6465746365707865;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)((long)&((element_type *)local_1a8._16_8_)->super_enable_shared_from_this<SyntaxTree> + 8))
    ->_M_allocated_capacity = 0x6669746e65646920;
    *(undefined4 *)&(((element_type *)local_1a8._16_8_)->token).begin = 0x6e656b6f;
    *(char *)((long)&(((enable_shared_from_this<SyntaxTree> *)local_e8)->_M_weak_this).
                     super___weak_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
             (long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&((element_type *)local_1a8._16_8_)->
                        super_enable_shared_from_this<SyntaxTree>)->_M_local_buf) = '\0';
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_1a8 + 0x20);
    local_1a8._0_4_ = 1;
    local_1a8._8_8_ = pTVar8;
    if ((element_type *)local_1a8._16_8_ == (element_type *)local_268) {
      local_1a8._40_8_ = local_268._8_8_;
      local_1a8._16_8_ = paVar1;
    }
    local_278.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_268._0_8_ = (ulong)local_e8 & 0xffffffffffffff00;
    paVar6 = &local_1e8.error.field_2;
    local_1e8._0_8_ = local_1a8._0_8_;
    local_1e8.context = pTVar8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._16_8_ == paVar1) {
      local_1e8.error.field_2._8_8_ = local_1a8._40_8_;
      local_1e8.error._M_dataplus._M_p = (pointer)paVar6;
    }
    else {
      local_1e8.error._M_dataplus._M_p = (pointer)local_1a8._16_8_;
    }
    local_1e8.error.field_2._M_allocated_capacity = (size_type)local_e8;
    local_1e8.error._M_string_length = (size_type)local_e8;
    local_1a8._24_8_ = 0;
    local_1a8._32_8_ = (ulong)local_e8 & 0xffffffffffffff00;
    IL._M_len = 1;
    IL._M_array = &local_1e8;
    local_278.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_268;
    local_1a8._16_8_ = paVar1;
    llvm_vecsmall::SmallVector<ParserError,_1U>::SmallVector
              ((SmallVector<ParserError,_1U> *)local_e8,IL);
    llvm_vecsmall::SmallVector<ParserError,_1U>::SmallVector
              ((SmallVector<ParserError,_1U> *)local_248,(SmallVector<ParserError,_1U> *)local_e8);
    auStack_240._72_8_ = (void *)0x2;
    llvm_vecsmall::SmallVectorImpl<ParserError>::~SmallVectorImpl
              ((SmallVectorImpl<ParserError> *)local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8.error._M_dataplus._M_p != paVar6) {
      operator_delete(local_1e8.error._M_dataplus._M_p,
                      (ulong)(local_1e8.error.field_2._M_allocated_capacity + 1));
    }
    NVar15 = (NodeType)local_268._16_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._16_8_ != paVar1) {
      operator_delete((void *)local_1a8._16_8_,local_1a8._32_8_ + 1);
    }
    __return_storage_ptr__->first = (TokenData *)auVar14;
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    ::_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                *)&__return_storage_ptr__->second,
               (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                *)local_248);
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
    ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                *)local_248);
  }
  else {
LAB_0019c133:
    bVar11 = eggs::variants::detail::
             apply<bool,is<ParserSuccess,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>(eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>const&)::_lambda(auto:1_const&)_1_,eggs::variants::detail::_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>,false,false>const&>
                       ((anon_class_1_0_00000001 *)local_248,
                        (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                         *)&local_148._tail);
    if (bVar11) {
      pSVar12 = (SyntaxTree *)operator_new(0x88);
      (pSVar12->super_enable_shared_from_this<SyntaxTree>)._M_weak_this.
      super___weak_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      (pSVar12->super_enable_shared_from_this<SyntaxTree>)._M_weak_this.
      super___weak_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pSVar12->type_ = NVar15;
      uVar7 = *(undefined4 *)&local_280->field_0x4;
      sVar5 = local_280->begin;
      (pSVar12->token).type = local_280->type;
      *(undefined4 *)&(pSVar12->token).field_0x4 = uVar7;
      (pSVar12->token).begin = sVar5;
      (pSVar12->token).end = local_280->end;
      (pSVar12->instream).super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (((shared_ptr<SyntaxTree::InputStream> *)(local_268._24_8_ + 0x10))->
               super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var3 = (((shared_ptr<SyntaxTree::InputStream> *)(local_268._24_8_ + 0x10))->
               super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
               _M_pi;
      (pSVar12->instream).super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var3;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      (pSVar12->parent_).super_OptionalBase<std::weak_ptr<SyntaxTree>_>.storage_.dummy_ = '\0';
      (pSVar12->udata).vtable = (vtable_type *)0x0;
      (pSVar12->childs).
      super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pSVar12->childs).
      super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      *(undefined8 *)
       ((long)&(pSVar12->childs).
               super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
      *(undefined8 *)
       ((long)&(pSVar12->childs).
               super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
      std::__shared_ptr<SyntaxTree,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SyntaxTree,void>
                ((__shared_ptr<SyntaxTree,(__gnu_cxx::_Lock_policy)2> *)local_248,pSVar12);
      if (local_f8 != 1) {
        eggs::variants::detail::throw_bad_variant_access<ParserSuccess&>();
      }
      SyntaxTree::take_childs((SyntaxTree *)local_248,(shared_ptr<SyntaxTree> *)&local_148._tail);
      uVar10 = auStack_240._0_8_;
      auVar9 = local_248;
      local_248 = (undefined1  [8])0x0;
      auStack_240._0_8_ = (undefined1 *)0x0;
      __return_storage_ptr__->first = (TokenData *)auVar14;
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->second)._storage.
        super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
        .
        super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
        .
        super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
        .field_0 = auVar9;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->second)._storage.
               super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
               .
               super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
               .
               super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
               .field_0 + 8) = uVar10;
      (__return_storage_ptr__->second)._storage.
      super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
      .
      super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
      ._which = 1;
    }
    else {
      eggs::variants::detail::
      _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
      ::_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                  *)&local_88,
                 (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                  *)&local_148._tail);
      giveup_to_expected((ParserState *)local_248,&local_88,"identifier");
      __return_storage_ptr__->first = (TokenData *)auVar14;
      eggs::variants::detail::
      _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
      ::_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                  *)&__return_storage_ptr__->second,
                 (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                  *)local_248);
      eggs::variants::detail::
      _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
      ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                  *)local_248);
      eggs::variants::detail::
      _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
      ::_destroy(&local_88._storage);
    }
  }
  eggs::variants::detail::
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
  ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
              *)&local_148._tail);
  if (NVar15 != Block) {
    return __return_storage_ptr__;
  }
LAB_0019c468:
  local_e8 = (undefined1  [8])((ulong)local_e8 & 0xffffffff00000000);
  make_error<ParserStatus,TokenStream::TokenData_const*&>
            ((ParserState *)local_248,(ParserStatus *)local_e8,&local_280);
  __return_storage_ptr__->first = end;
  eggs::variants::detail::
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
  ::_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
              *)&__return_storage_ptr__->second,
             (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
              *)local_248);
  eggs::variants::detail::
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
  ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
              *)local_248);
  return __return_storage_ptr__;
}

Assistant:

static ParserResult parse_variable_declaration(ParserContext& parser, token_iterator begin, token_iterator end)
{
    if(begin != end)
    {
        NodeType type = begin->type == Token::VAR_INT? NodeType::VAR_INT :
                        begin->type == Token::LVAR_INT? NodeType::LVAR_INT :
                        begin->type == Token::VAR_FLOAT? NodeType::VAR_FLOAT :
                        begin->type == Token::LVAR_FLOAT? NodeType::LVAR_FLOAT :
                        begin->type == Token::VAR_TEXT_LABEL? NodeType::VAR_TEXT_LABEL :
                        begin->type == Token::LVAR_TEXT_LABEL? NodeType::LVAR_TEXT_LABEL :
                        begin->type == Token::VAR_TEXT_LABEL16? NodeType::VAR_TEXT_LABEL16 :
                        begin->type == Token::LVAR_TEXT_LABEL16? NodeType::LVAR_TEXT_LABEL16 :
                                                                   NodeType::Block;

        if(type != NodeType::Block)
        {
            auto it = std::next(begin);
            ParserState idents;

            std::tie(it, idents) = parse_until_if(parse_identifier, parser, it, end, [](token_iterator t) {
                return t->type == Token::NewLine;
            });

            if(it != end)
            {
                assert(it->type == Token::NewLine);
                ++it;
            }

            if(is<ParserSuccess>(idents) && get<ParserSuccess>(idents).tree->child_count() == 0)
            {
                return std::make_pair(it, make_error(ParserStatus::Error, begin, "expected identifier after this token"));
            }

            if(is<ParserSuccess>(idents))
            {
                shared_ptr<SyntaxTree> tree(new SyntaxTree(type, parser.instream, *begin));
                tree->take_childs(get<ParserSuccess>(idents).tree);
                return std::make_pair(it, ParserSuccess(std::move(tree)));
            }
            else
            {
                return std::make_pair(it, giveup_to_expected(std::move(idents), "identifier"));
            }
        }
    }
    return std::make_pair(end, make_error(ParserStatus::GiveUp, begin));
}